

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  ulong uVar1;
  undefined **ppuVar2;
  bool bVar3;
  uint compressed_length;
  ostream *poVar4;
  undefined7 extraout_var;
  size_type __n;
  undefined **ppuVar5;
  ulong uVar6;
  int iVar7;
  long lVar8;
  char *pcVar9;
  size_t data_size;
  path *this;
  size_t module_size;
  basic_string_view<char,_std::char_traits<char>_> __x_01;
  basic_string_view<char,_std::char_traits<char>_> __x_02;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_01;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_02;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_4c0;
  ulong local_4a8;
  undefined **local_4a0;
  ulong local_498;
  ulong local_490;
  path in_filename;
  path out_filename;
  char *end;
  string_view arg;
  
  std::filesystem::__cxx11::path::path(&in_filename);
  std::filesystem::__cxx11::path::path(&out_filename);
  if (argc < 2) {
    argc = 1;
  }
  module_size = 0x1000;
  uVar6 = 0;
  local_4a0 = (undefined **)0x0;
  local_490 = 0;
  local_498 = 0;
  while( true ) {
    uVar1 = local_490;
    ppuVar2 = local_4a0;
    if (uVar6 == argc - 1) break;
    pcVar9 = argv[uVar6 + 1];
    arg._M_len = strlen(pcVar9);
    arg._M_str = pcVar9;
    if (*pcVar9 == '-') {
      __x_01._M_str = pcVar9;
      __x_01._M_len = arg._M_len;
      __y._M_str = "-h";
      __y._M_len = 2;
      bVar3 = std::operator==(__x_01,__y);
      if ((bVar3) ||
         (__x._M_str = arg._M_str, __x._M_len = arg._M_len, __y_00._M_str = "--help",
         __y_00._M_len = 6, bVar3 = std::operator==(__x,__y_00), bVar3)) {
        PrintUsage();
        ppuVar2 = local_4a0;
      }
      else if (arg._M_str[1] == 'm') {
        poVar4 = (ostream *)std::basic_string_view<char,_std::char_traits<char>_>::find(&arg,'=',0);
        if (poVar4 != (ostream *)0xffffffffffffffff) {
          module_size = strtoul(argv[uVar6 + 1] + (long)poVar4 + 1,&end,0);
          if (*end != '\0') {
            std::operator<<((ostream *)&std::cerr,"Invalid parameter to -m\n");
            iVar7 = 1;
            goto LAB_0010326f;
          }
          poVar4 = (ostream *)end;
          if (0x1000 < module_size) {
            poVar4 = std::operator<<((ostream *)&std::cerr,
                                     "Warning: the moduled format header does not fully support sizes greater than\n 0x1000 - header will likely be invalid!\n"
                                    );
          }
        }
        local_490 = CONCAT71((int7)((ulong)poVar4 >> 8),1);
        ppuVar2 = local_4a0;
      }
      else {
        __x_02._M_str = arg._M_str;
        __x_02._M_len = arg._M_len;
        __y_01._M_str = "-d";
        __y_01._M_len = 2;
        bVar3 = std::operator==(__x_02,__y_01);
        if (bVar3) {
          local_498 = CONCAT71(extraout_var,1);
          ppuVar2 = local_4a0;
        }
        else {
          lVar8 = 0x4e0;
          ppuVar5 = &PTR__ofstream_00110130;
          local_4a8 = module_size;
          do {
            module_size = local_4a8;
            ppuVar2 = local_4a0;
            if (lVar8 == 0) break;
            ppuVar2 = ppuVar5 + 0xd;
            __x_00._M_str = arg._M_str;
            __x_00._M_len = arg._M_len;
            __y_02._M_str = ppuVar5[0xd];
            __y_02._M_len = (size_t)ppuVar5[0xe];
            bVar3 = std::operator==(__x_00,__y_02);
            lVar8 = lVar8 + -0x68;
            ppuVar5 = ppuVar2;
            module_size = local_4a8;
          } while (!bVar3);
        }
      }
    }
    else {
      this = &out_filename;
      if (in_filename._M_pathname._M_string_length == 0) {
        this = &in_filename;
      }
      std::filesystem::__cxx11::path::operator=(this,&arg);
      ppuVar2 = local_4a0;
    }
    local_4a0 = ppuVar2;
    uVar6 = uVar6 + 1;
  }
  if (in_filename._M_pathname._M_string_length == 0) {
    pcVar9 = "Error: Input file not specified\n";
LAB_00102c2b:
    iVar7 = 1;
    std::operator<<((ostream *)&std::cerr,pcVar9);
    PrintUsage();
    goto LAB_0010326f;
  }
  if (local_4a0 == (undefined **)0x0) {
    pcVar9 = "Error: Format not specified\n";
    goto LAB_00102c2b;
  }
  if (out_filename._M_pathname._M_string_length == 0) {
    std::filesystem::__cxx11::path::operator=
              (&out_filename,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)local_4a0 + (ulong)(((uint)local_490 & 1) << 5) + 0x28));
  }
  std::ofstream::ofstream(&end);
  std::ios::exceptions((int)&end + (int)*(undefined8 *)(end + -0x18));
  uVar6 = local_498;
  std::ofstream::open((char *)&end,(_Ios_Openmode)out_filename._M_pathname._M_dataplus._M_p);
  if ((uVar6 & 1) == 0) {
    __n = std::filesystem::file_size(&in_filename);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_4c0,__n,
               (allocator_type *)&arg);
    std::ifstream::ifstream(&arg);
    std::ios::exceptions((int)&arg + (int)*(undefined8 *)(arg._M_len - 0x18));
    std::basic_ifstream<char,_std::char_traits<char>_>::open<std::filesystem::__cxx11::path>
              ((basic_ifstream<char,_std::char_traits<char>_> *)&arg,&in_filename,_S_in|_S_bin);
    std::istream::read((char *)&arg,(long)local_4c0._M_impl.super__Vector_impl_data._M_start);
    std::ifstream::~ifstream(&arg);
    switch(*(undefined4 *)(ppuVar2 + 4)) {
    case 0:
      if ((uVar1 & 1) == 0) {
        bVar3 = ClownLZSS::ChameleonCompress<std::ofstream&>
                          (local_4c0._M_impl.super__Vector_impl_data._M_start,
                           (long)local_4c0._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_4c0._M_impl.super__Vector_impl_data._M_start,
                           (basic_ofstream<char,_std::char_traits<char>_> *)&end);
      }
      else {
        bVar3 = ClownLZSS::ModuledChameleonCompress<std::ofstream&>
                          (local_4c0._M_impl.super__Vector_impl_data._M_start,
                           (long)local_4c0._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_4c0._M_impl.super__Vector_impl_data._M_start,
                           (basic_ofstream<char,_std::char_traits<char>_> *)&end,module_size);
      }
      break;
    case 1:
      if ((uVar1 & 1) == 0) {
        bVar3 = ClownLZSS::ComperCompress<std::ofstream&>
                          (local_4c0._M_impl.super__Vector_impl_data._M_start,
                           (long)local_4c0._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_4c0._M_impl.super__Vector_impl_data._M_start,
                           (basic_ofstream<char,_std::char_traits<char>_> *)&end);
      }
      else {
        bVar3 = ClownLZSS::ModuledComperCompress<std::ofstream&>
                          (local_4c0._M_impl.super__Vector_impl_data._M_start,
                           (long)local_4c0._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_4c0._M_impl.super__Vector_impl_data._M_start,
                           (basic_ofstream<char,_std::char_traits<char>_> *)&end,module_size);
      }
      break;
    case 2:
      if ((uVar1 & 1) == 0) {
        bVar3 = ClownLZSS::EnigmaCompress<std::ofstream&>
                          (local_4c0._M_impl.super__Vector_impl_data._M_start,
                           (long)local_4c0._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_4c0._M_impl.super__Vector_impl_data._M_start,
                           (basic_ofstream<char,_std::char_traits<char>_> *)&end);
      }
      else {
        bVar3 = ClownLZSS::ModuledEnigmaCompress<std::ofstream&>
                          (local_4c0._M_impl.super__Vector_impl_data._M_start,
                           (long)local_4c0._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_4c0._M_impl.super__Vector_impl_data._M_start,
                           (basic_ofstream<char,_std::char_traits<char>_> *)&end,module_size);
      }
      break;
    case 3:
      if ((uVar1 & 1) == 0) {
        bVar3 = ClownLZSS::FaxmanCompress<std::ofstream&>
                          (local_4c0._M_impl.super__Vector_impl_data._M_start,
                           (long)local_4c0._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_4c0._M_impl.super__Vector_impl_data._M_start,
                           (basic_ofstream<char,_std::char_traits<char>_> *)&end);
      }
      else {
        bVar3 = ClownLZSS::ModuledFaxmanCompress<std::ofstream&>
                          (local_4c0._M_impl.super__Vector_impl_data._M_start,
                           (long)local_4c0._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_4c0._M_impl.super__Vector_impl_data._M_start,
                           (basic_ofstream<char,_std::char_traits<char>_> *)&end,module_size);
      }
      break;
    case 4:
      if ((uVar1 & 1) == 0) {
        bVar3 = ClownLZSS::GbaCompress<std::ofstream&>
                          (local_4c0._M_impl.super__Vector_impl_data._M_start,
                           (long)local_4c0._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_4c0._M_impl.super__Vector_impl_data._M_start,
                           (basic_ofstream<char,_std::char_traits<char>_> *)&end);
      }
      else {
        bVar3 = ClownLZSS::ModuledGbaCompress<std::ofstream&>
                          (local_4c0._M_impl.super__Vector_impl_data._M_start,
                           (long)local_4c0._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_4c0._M_impl.super__Vector_impl_data._M_start,
                           (basic_ofstream<char,_std::char_traits<char>_> *)&end,module_size);
      }
      break;
    case 5:
      if ((uVar1 & 1) == 0) {
        bVar3 = ClownLZSS::GbaVramSafeCompress<std::ofstream&>
                          (local_4c0._M_impl.super__Vector_impl_data._M_start,
                           (long)local_4c0._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_4c0._M_impl.super__Vector_impl_data._M_start,
                           (basic_ofstream<char,_std::char_traits<char>_> *)&end);
      }
      else {
        bVar3 = ClownLZSS::ModuledGbaVramSafeCompress<std::ofstream&>
                          (local_4c0._M_impl.super__Vector_impl_data._M_start,
                           (long)local_4c0._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_4c0._M_impl.super__Vector_impl_data._M_start,
                           (basic_ofstream<char,_std::char_traits<char>_> *)&end,module_size);
      }
      break;
    case 6:
      if ((uVar1 & 1) == 0) {
        bVar3 = ClownLZSS::KosinskiCompress<std::ofstream&>
                          (local_4c0._M_impl.super__Vector_impl_data._M_start,
                           (long)local_4c0._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_4c0._M_impl.super__Vector_impl_data._M_start,
                           (basic_ofstream<char,_std::char_traits<char>_> *)&end);
      }
      else {
        bVar3 = ClownLZSS::ModuledKosinskiCompress<std::ofstream&>
                          (local_4c0._M_impl.super__Vector_impl_data._M_start,
                           (long)local_4c0._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_4c0._M_impl.super__Vector_impl_data._M_start,
                           (basic_ofstream<char,_std::char_traits<char>_> *)&end,module_size);
      }
      break;
    case 7:
      if ((uVar1 & 1) == 0) {
        bVar3 = ClownLZSS::KosinskiPlusCompress<std::ofstream&>
                          (local_4c0._M_impl.super__Vector_impl_data._M_start,
                           (long)local_4c0._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_4c0._M_impl.super__Vector_impl_data._M_start,
                           (basic_ofstream<char,_std::char_traits<char>_> *)&end);
      }
      else {
        bVar3 = ClownLZSS::ModuledKosinskiPlusCompress<std::ofstream&>
                          (local_4c0._M_impl.super__Vector_impl_data._M_start,
                           (long)local_4c0._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_4c0._M_impl.super__Vector_impl_data._M_start,
                           (basic_ofstream<char,_std::char_traits<char>_> *)&end,module_size);
      }
      break;
    case 8:
      if ((uVar1 & 1) == 0) {
        bVar3 = ClownLZSS::RageCompress<std::ofstream&>
                          (local_4c0._M_impl.super__Vector_impl_data._M_start,
                           (long)local_4c0._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_4c0._M_impl.super__Vector_impl_data._M_start,
                           (basic_ofstream<char,_std::char_traits<char>_> *)&end);
      }
      else {
        bVar3 = ClownLZSS::ModuledRageCompress<std::ofstream&>
                          (local_4c0._M_impl.super__Vector_impl_data._M_start,
                           (long)local_4c0._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_4c0._M_impl.super__Vector_impl_data._M_start,
                           (basic_ofstream<char,_std::char_traits<char>_> *)&end,module_size);
      }
      break;
    case 9:
      if ((uVar1 & 1) == 0) {
        bVar3 = ClownLZSS::RocketCompress<std::ofstream&>
                          (local_4c0._M_impl.super__Vector_impl_data._M_start,
                           (long)local_4c0._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_4c0._M_impl.super__Vector_impl_data._M_start,
                           (basic_ofstream<char,_std::char_traits<char>_> *)&end);
      }
      else {
        bVar3 = ClownLZSS::ModuledRocketCompress<std::ofstream&>
                          (local_4c0._M_impl.super__Vector_impl_data._M_start,
                           (long)local_4c0._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_4c0._M_impl.super__Vector_impl_data._M_start,
                           (basic_ofstream<char,_std::char_traits<char>_> *)&end,module_size);
      }
      break;
    case 10:
      data_size = (long)local_4c0._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_4c0._M_impl.super__Vector_impl_data._M_start;
      if ((uVar1 & 1) == 0) {
        bVar3 = ClownLZSS::SaxmanCompressWithHeader<std::ofstream&>
                          (local_4c0._M_impl.super__Vector_impl_data._M_start,data_size,
                           (basic_ofstream<char,_std::char_traits<char>_> *)&end);
      }
      else {
LAB_00103057:
        bVar3 = ClownLZSS::ModuledSaxmanCompress<std::ofstream&>
                          (local_4c0._M_impl.super__Vector_impl_data._M_start,data_size,
                           (basic_ofstream<char,_std::char_traits<char>_> *)&end,module_size);
      }
      break;
    case 0xb:
      data_size = (long)local_4c0._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_4c0._M_impl.super__Vector_impl_data._M_start;
      if ((uVar1 & 1) != 0) goto LAB_00103057;
      bVar3 = ClownLZSS::SaxmanCompressWithoutHeader<std::ofstream&>
                        (local_4c0._M_impl.super__Vector_impl_data._M_start,data_size,
                         (basic_ofstream<char,_std::char_traits<char>_> *)&end);
      break;
    default:
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_4c0);
      goto LAB_0010324c;
    }
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_4c0);
    iVar7 = 0;
    if (bVar3 == false) {
LAB_0010324c:
      std::operator<<((ostream *)&std::cerr,"Error: File could not be compressed\n");
      iVar7 = 1;
    }
  }
  else {
    std::ifstream::ifstream(&arg);
    std::ios::exceptions((int)&arg + (int)*(undefined8 *)(arg._M_len - 0x18));
    std::ifstream::open((char *)&arg,(_Ios_Openmode)in_filename._M_pathname._M_dataplus._M_p);
    switch(*(undefined4 *)(ppuVar2 + 4)) {
    case 0:
      if ((uVar1 & 1) == 0) {
        ClownLZSS::ChameleonDecompress<std::ifstream&,std::ofstream&>
                  ((basic_ifstream<char,_std::char_traits<char>_> *)&arg,
                   (basic_ofstream<char,_std::char_traits<char>_> *)&end);
      }
      else {
        ClownLZSS::ModuledChameleonDecompress<std::ifstream&,std::ofstream&>
                  ((basic_ifstream<char,_std::char_traits<char>_> *)&arg,
                   (basic_ofstream<char,_std::char_traits<char>_> *)&end);
      }
      break;
    case 1:
      if ((uVar1 & 1) == 0) {
        ClownLZSS::ComperDecompress<std::ifstream&,std::ofstream&>
                  ((basic_ifstream<char,_std::char_traits<char>_> *)&arg,
                   (basic_ofstream<char,_std::char_traits<char>_> *)&end);
      }
      else {
        ClownLZSS::ModuledComperDecompress<std::ifstream&,std::ofstream&>
                  ((basic_ifstream<char,_std::char_traits<char>_> *)&arg,
                   (basic_ofstream<char,_std::char_traits<char>_> *)&end);
      }
      break;
    case 2:
      if ((uVar1 & 1) == 0) {
        ClownLZSS::EnigmaDecompress<std::ifstream&,std::ofstream&>
                  ((basic_ifstream<char,_std::char_traits<char>_> *)&arg,
                   (basic_ofstream<char,_std::char_traits<char>_> *)&end);
      }
      else {
        ClownLZSS::ModuledEnigmaDecompress<std::ifstream&,std::ofstream&>
                  ((basic_ifstream<char,_std::char_traits<char>_> *)&arg,
                   (basic_ofstream<char,_std::char_traits<char>_> *)&end);
      }
      break;
    case 3:
      if ((uVar1 & 1) == 0) {
        ClownLZSS::FaxmanDecompress<std::ifstream&,std::ofstream&>
                  ((basic_ifstream<char,_std::char_traits<char>_> *)&arg,
                   (basic_ofstream<char,_std::char_traits<char>_> *)&end);
      }
      else {
        ClownLZSS::ModuledFaxmanDecompress<std::ifstream&,std::ofstream&>
                  ((basic_ifstream<char,_std::char_traits<char>_> *)&arg,
                   (basic_ofstream<char,_std::char_traits<char>_> *)&end);
      }
      break;
    case 4:
    case 5:
      if ((uVar1 & 1) == 0) {
        ClownLZSS::GbaDecompress<std::ifstream&,std::ofstream&>
                  ((basic_ifstream<char,_std::char_traits<char>_> *)&arg,
                   (basic_ofstream<char,_std::char_traits<char>_> *)&end);
      }
      else {
        ClownLZSS::ModuledGbaDecompress<std::ifstream&,std::ofstream&>
                  ((basic_ifstream<char,_std::char_traits<char>_> *)&arg,
                   (basic_ofstream<char,_std::char_traits<char>_> *)&end);
      }
      break;
    case 6:
      if ((uVar1 & 1) == 0) {
        ClownLZSS::KosinskiDecompress<std::ifstream&,std::ofstream&>
                  ((basic_ifstream<char,_std::char_traits<char>_> *)&arg,
                   (basic_ofstream<char,_std::char_traits<char>_> *)&end);
      }
      else {
        ClownLZSS::ModuledKosinskiDecompress<std::ifstream&,std::ofstream&>
                  ((basic_ifstream<char,_std::char_traits<char>_> *)&arg,
                   (basic_ofstream<char,_std::char_traits<char>_> *)&end);
      }
      break;
    case 7:
      if ((uVar1 & 1) == 0) {
        ClownLZSS::KosinskiPlusDecompress<std::ifstream&,std::ofstream&>
                  ((basic_ifstream<char,_std::char_traits<char>_> *)&arg,
                   (basic_ofstream<char,_std::char_traits<char>_> *)&end);
      }
      else {
        ClownLZSS::ModuledKosinskiPlusDecompress<std::ifstream&,std::ofstream&>
                  ((basic_ifstream<char,_std::char_traits<char>_> *)&arg,
                   (basic_ofstream<char,_std::char_traits<char>_> *)&end);
      }
      break;
    case 8:
      if ((uVar1 & 1) == 0) {
        ClownLZSS::RageDecompress<std::ifstream&,std::ofstream&>
                  ((basic_ifstream<char,_std::char_traits<char>_> *)&arg,
                   (basic_ofstream<char,_std::char_traits<char>_> *)&end);
      }
      else {
        ClownLZSS::ModuledRageDecompress<std::ifstream&,std::ofstream&>
                  ((basic_ifstream<char,_std::char_traits<char>_> *)&arg,
                   (basic_ofstream<char,_std::char_traits<char>_> *)&end);
      }
      break;
    case 9:
      if ((uVar1 & 1) == 0) {
        ClownLZSS::RocketDecompress<std::ifstream&,std::ofstream&>
                  ((basic_ifstream<char,_std::char_traits<char>_> *)&arg,
                   (basic_ofstream<char,_std::char_traits<char>_> *)&end);
      }
      else {
        ClownLZSS::ModuledRocketDecompress<std::ifstream&,std::ofstream&>
                  ((basic_ifstream<char,_std::char_traits<char>_> *)&arg,
                   (basic_ofstream<char,_std::char_traits<char>_> *)&end);
      }
      break;
    case 10:
      if ((uVar1 & 1) == 0) {
        ClownLZSS::SaxmanDecompress<std::ifstream&,std::ofstream&>
                  ((basic_ifstream<char,_std::char_traits<char>_> *)&arg,
                   (basic_ofstream<char,_std::char_traits<char>_> *)&end);
      }
      else {
LAB_00102e5f:
        ClownLZSS::ModuledSaxmanDecompress<std::ifstream&,std::ofstream&>
                  ((basic_ifstream<char,_std::char_traits<char>_> *)&arg,
                   (basic_ofstream<char,_std::char_traits<char>_> *)&end);
      }
      break;
    case 0xb:
      if ((uVar1 & 1) != 0) goto LAB_00102e5f;
      compressed_length = std::filesystem::file_size(&in_filename);
      ClownLZSS::SaxmanDecompress<std::ifstream&,std::ofstream&>
                ((basic_ifstream<char,_std::char_traits<char>_> *)&arg,
                 (basic_ofstream<char,_std::char_traits<char>_> *)&end,compressed_length);
    }
    std::ifstream::~ifstream(&arg);
    iVar7 = 0;
  }
  std::ofstream::~ofstream(&end);
LAB_0010326f:
  std::filesystem::__cxx11::path::~path(&out_filename);
  std::filesystem::__cxx11::path::~path(&in_filename);
  return iVar7;
}

Assistant:

int main(int argc, char **argv)
{
	int exit_code = EXIT_SUCCESS;

	const Mode *mode = NULL;
	std::filesystem::path in_filename;
	std::filesystem::path out_filename;
	bool moduled = false, decompress = false;
	std::size_t module_size = 0x1000;

	/* Skip past the executable name */
	--argc;
	++argv;

	/* Parse arguments */
	for (int i = 0; i < argc; ++i)
	{
		const std::string_view arg(argv[i]);

		if (arg[0] == '-')
		{
			if (arg == "-h" || arg == "--help")
			{
				PrintUsage();
			}
			else if (arg[1] == 'm')
			{
				moduled = true;

				const auto argument_position = arg.find_first_of('=');

				if (argument_position != arg.npos)
				{
					char *end;
					unsigned long result = std::strtoul(&argv[i][argument_position + 1], &end, 0);

					if (*end != '\0')
					{
						std::cerr << "Invalid parameter to -m\n";
						exit_code = EXIT_FAILURE;
						break;
					}
					else
					{
						module_size = result;

						if (module_size > 0x1000)
							std::cerr << "Warning: the moduled format header does not fully support sizes greater than\n 0x1000 - header will likely be invalid!\n";
					}
				}
			}
			else if (arg == "-d")
			{
				decompress = true;
			}
			else
			{
				for (const auto &current_mode : modes)
				{
					if (arg == current_mode.command)
					{
						mode = &current_mode;
						break;
					}
				}
			}
		}
		else
		{
			if (in_filename.empty())
				in_filename = arg;
			else
				out_filename = arg;
		}
	}

	if (exit_code != EXIT_FAILURE)
	{
		if (in_filename.empty())
		{
			exit_code = EXIT_FAILURE;
			std::cerr << "Error: Input file not specified\n";
			PrintUsage();
		}
		else if (mode == NULL)
		{
			exit_code = EXIT_FAILURE;
			std::cerr << "Error: Format not specified\n";
			PrintUsage();
		}
		else
		{
			if (out_filename.empty())
				out_filename = moduled ? mode->moduled_default_filename : mode->normal_default_filename;

			try
			{
				std::ofstream out_file;
				out_file.exceptions(out_file.badbit | out_file.eofbit | out_file.failbit);
				out_file.open(out_filename, decompress ? out_file.trunc | out_file.in | out_file.out | out_file.binary : out_file.out | out_file.binary);

				if (decompress)
				{
					std::ifstream in_file;
					in_file.exceptions(in_file.badbit | in_file.eofbit | in_file.failbit);
					in_file.open(in_filename, in_file.in | in_file.binary);

					switch (mode->format)
					{
						case Format::CHAMELEON:
							if (moduled)
								ClownLZSS::ModuledChameleonDecompress(in_file, out_file);
							else
								ClownLZSS::ChameleonDecompress(in_file, out_file);
							break;

						case Format::COMPER:
							if (moduled)
								ClownLZSS::ModuledComperDecompress(in_file, out_file);
							else
								ClownLZSS::ComperDecompress(in_file, out_file);
							break;

						case Format::ENIGMA:
							if (moduled)
								ClownLZSS::ModuledEnigmaDecompress(in_file, out_file);
							else
								ClownLZSS::EnigmaDecompress(in_file, out_file);
							break;

						case Format::FAXMAN:
							if (moduled)
								ClownLZSS::ModuledFaxmanDecompress(in_file, out_file);
							else
								ClownLZSS::FaxmanDecompress(in_file, out_file);
							break;

						case Format::GBA:
						case Format::GBA_VRAM_SAFE:
							if (moduled)
								ClownLZSS::ModuledGbaDecompress(in_file, out_file);
							else
								ClownLZSS::GbaDecompress(in_file, out_file);
							break;

						case Format::KOSINSKI:
							if (moduled)
								ClownLZSS::ModuledKosinskiDecompress(in_file, out_file);
							else
								ClownLZSS::KosinskiDecompress(in_file, out_file);
							break;

						case Format::KOSINSKIPLUS:
							if (moduled)
								ClownLZSS::ModuledKosinskiPlusDecompress(in_file, out_file);
							else
								ClownLZSS::KosinskiPlusDecompress(in_file, out_file);
							break;

						case Format::RAGE:
							if (moduled)
								ClownLZSS::ModuledRageDecompress(in_file, out_file);
							else
								ClownLZSS::RageDecompress(in_file, out_file);
							break;

						case Format::ROCKET:
							if (moduled)
								ClownLZSS::ModuledRocketDecompress(in_file, out_file);
							else
								ClownLZSS::RocketDecompress(in_file, out_file);
							break;

						case Format::SAXMAN:
							if (moduled)
								ClownLZSS::ModuledSaxmanDecompress(in_file, out_file);
							else
								ClownLZSS::SaxmanDecompress(in_file, out_file);
							break;

						case Format::SAXMAN_NO_HEADER:
							if (moduled)
								ClownLZSS::ModuledSaxmanDecompress(in_file, out_file);
							else
								ClownLZSS::SaxmanDecompress(in_file, out_file, std::filesystem::file_size(in_filename));
							break;
					}
				}
				else
				{
					const bool success = [&]() -> bool
					{
						const auto file_buffer = FileToBuffer(in_filename);

						switch (mode->format)
						{
							case Format::CHAMELEON:
								if (moduled)
									return ClownLZSS::ModuledChameleonCompress(file_buffer.data(), file_buffer.size(), out_file, module_size);
								else
									return ClownLZSS::ChameleonCompress(file_buffer.data(), file_buffer.size(), out_file);

							case Format::COMPER:
								if (moduled)
									return ClownLZSS::ModuledComperCompress(file_buffer.data(), file_buffer.size(), out_file, module_size);
								else
									return ClownLZSS::ComperCompress(file_buffer.data(), file_buffer.size(), out_file);

							case Format::ENIGMA:
								if (moduled)
									return ClownLZSS::ModuledEnigmaCompress(file_buffer.data(), file_buffer.size(), out_file, module_size);
								else
									return ClownLZSS::EnigmaCompress(file_buffer.data(), file_buffer.size(), out_file);

							case Format::FAXMAN:
								if (moduled)
									return ClownLZSS::ModuledFaxmanCompress(file_buffer.data(), file_buffer.size(), out_file, module_size);
								else
									return ClownLZSS::FaxmanCompress(file_buffer.data(), file_buffer.size(), out_file);

							case Format::GBA:
								if (moduled)
									return ClownLZSS::ModuledGbaCompress(file_buffer.data(), file_buffer.size(), out_file, module_size);
								else
									return ClownLZSS::GbaCompress(file_buffer.data(), file_buffer.size(), out_file);

							case Format::GBA_VRAM_SAFE:
								if (moduled)
									return ClownLZSS::ModuledGbaVramSafeCompress(file_buffer.data(), file_buffer.size(), out_file, module_size);
								else
									return ClownLZSS::GbaVramSafeCompress(file_buffer.data(), file_buffer.size(), out_file);

							case Format::KOSINSKI:
								if (moduled)
									return ClownLZSS::ModuledKosinskiCompress(file_buffer.data(), file_buffer.size(), out_file, module_size);
								else
									return ClownLZSS::KosinskiCompress(file_buffer.data(), file_buffer.size(), out_file);

							case Format::KOSINSKIPLUS:
								if (moduled)
									return ClownLZSS::ModuledKosinskiPlusCompress(file_buffer.data(), file_buffer.size(), out_file, module_size);
								else
									return ClownLZSS::KosinskiPlusCompress(file_buffer.data(), file_buffer.size(), out_file);

							case Format::RAGE:
								if (moduled)
									return ClownLZSS::ModuledRageCompress(file_buffer.data(), file_buffer.size(), out_file, module_size);
								else
									return ClownLZSS::RageCompress(file_buffer.data(), file_buffer.size(), out_file);

							case Format::ROCKET:
								if (moduled)
									return ClownLZSS::ModuledRocketCompress(file_buffer.data(), file_buffer.size(), out_file, module_size);
								else
									return ClownLZSS::RocketCompress(file_buffer.data(), file_buffer.size(), out_file);

							case Format::SAXMAN:
								if (moduled)
									return ClownLZSS::ModuledSaxmanCompress(file_buffer.data(), file_buffer.size(), out_file, module_size);
								else
									return ClownLZSS::SaxmanCompressWithHeader(file_buffer.data(), file_buffer.size(), out_file);

							case Format::SAXMAN_NO_HEADER:
								if (moduled)
									return ClownLZSS::ModuledSaxmanCompress(file_buffer.data(), file_buffer.size(), out_file, module_size);
								else
									return ClownLZSS::SaxmanCompressWithoutHeader(file_buffer.data(), file_buffer.size(), out_file);
						}

						return false;
					}();

					if (!success)
					{
						exit_code = EXIT_FAILURE;
						std::cerr << "Error: File could not be compressed\n";
					}
				}
			}
			catch (const std::ios_base::failure& fail)
			{
				exit_code = EXIT_FAILURE;
				std::cerr << "Error: File IO failure with description '" << fail.what() << "'\n";
			}
		}
	}

	return exit_code;
}